

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::post_file_progress(torrent *this,file_progress_flags_t flags)

{
  int iVar1;
  undefined4 extraout_var;
  vector<std::int64_t,_file_index_t> fp;
  undefined1 auStack_38 [24];
  element_type *peStack_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  auStack_38._16_8_ =
       (__uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
        )0x0;
  peStack_20 = (element_type *)0x0;
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  file_progress(this,(vector<std::int64_t,_file_index_t> *)(auStack_38 + 0x10),flags);
  iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  get_handle((torrent *)auStack_38);
  alert_manager::
  emplace_alert<libtorrent::file_progress_alert,libtorrent::torrent_handle,libtorrent::aux::container_wrapper<long,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<long,std::allocator<long>>>>
            ((alert_manager *)CONCAT44(extraout_var,iVar1),(torrent_handle *)auStack_38,
             (container_wrapper<long,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<long,_std::allocator<long>_>_>
              *)(auStack_38 + 0x10));
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_38 + 8));
  ::std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)(auStack_38 + 0x10));
  return;
}

Assistant:

void torrent::post_file_progress(file_progress_flags_t const flags)
	{
		aux::vector<std::int64_t, file_index_t> fp;
		file_progress(fp, flags);
		alerts().emplace_alert<file_progress_alert>(get_handle(), std::move(fp));
	}